

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  undefined8 *puVar4;
  pkt_buf *ppVar5;
  uint in_ECX;
  long in_RDX;
  long in_RDI;
  pkt_buf *buf_1;
  vring_desc *desc_1;
  uint16_t idx;
  pkt_buf *buf;
  vring_desc *desc;
  vring_used_elem *e;
  uint32_t buf_idx;
  virtqueue *vq;
  ixy_device *__mptr;
  virtio_device *dev;
  uint16_t in_stack_ffffffffffffff5e;
  virtio_device *in_stack_ffffffffffffff60;
  ushort local_72;
  uint local_44;
  
  puVar1 = *(uint **)(in_RDI + 0x48);
  local_44 = 0;
  while ((local_44 < in_ECX && ((short)puVar1[10] != *(short *)(*(long *)(puVar1 + 6) + 2)))) {
    puVar3 = (uint *)(*(long *)(puVar1 + 6) + 4 + ((ulong)(ushort)puVar1[10] % (ulong)*puVar1) * 8);
    puVar4 = (undefined8 *)(*(long *)(puVar1 + 2) + (ulong)*puVar3 * 0x10);
    *(short *)(puVar1 + 10) = (short)puVar1[10] + 1;
    if (*(short *)((long)puVar4 + 0xc) != 2) {
      fprintf(_stderr,"[ERROR] %s:%d %s(): unsupported rx flags on descriptor: %x\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
              ,0x180,"virtio_rx_batch",(ulong)*(ushort *)((long)puVar4 + 0xc));
      abort();
    }
    *puVar4 = 0;
    puVar4[1] = 0;
    lVar2 = *(long *)(puVar1 + (ulong)*puVar3 * 2 + 0xe);
    *(uint *)(lVar2 + 0x14) = puVar3[1];
    *(long *)(in_RDX + (ulong)local_44 * 8) = lVar2;
    *(ulong *)(in_RDI + 0x70) = (ulong)*(uint *)(lVar2 + 0x14) + *(long *)(in_RDI + 0x70);
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    local_44 = local_44 + 1;
  }
  local_72 = 0;
  do {
    if (*puVar1 <= (uint)local_72) {
      return local_44;
    }
    if (*(long *)(*(long *)(puVar1 + 2) + (ulong)local_72 * 0x10) == 0) {
      ppVar5 = pkt_buf_alloc((mempool *)in_stack_ffffffffffffff60);
      if (ppVar5 == (pkt_buf *)0x0) {
        fprintf(_stderr,
                "[ERROR] %s:%d %s(): failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small\n"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
                ,0x199,"virtio_rx_batch");
        abort();
      }
      ppVar5->size = *(uint32_t *)(*(long *)(puVar1 + 0xc) + 8);
      *(undefined8 *)(ppVar5->head_room + 0x1d) = 0x2a0000;
      ppVar5->head_room[0x25] = '\0';
      ppVar5->head_room[0x26] = '\0';
      *(uint32_t *)(*(long *)(puVar1 + 2) + (ulong)local_72 * 0x10 + 8) = ppVar5->size + 10;
      *(uintptr_t *)(*(long *)(puVar1 + 2) + (ulong)local_72 * 0x10) = ppVar5->buf_addr_phy + 0x36;
      *(undefined2 *)(*(long *)(puVar1 + 2) + (ulong)local_72 * 0x10 + 0xc) = 2;
      *(undefined2 *)(*(long *)(puVar1 + 2) + (ulong)local_72 * 0x10 + 0xe) = 0;
      *(pkt_buf **)(puVar1 + (ulong)local_72 * 2 + 0xe) = ppVar5;
      in_stack_ffffffffffffff60 = *(virtio_device **)(puVar1 + 4);
      *(ushort *)
       ((long)&(in_stack_ffffffffffffff60->ixy).pci_addr +
       ((ulong)*(ushort *)(*(long *)(puVar1 + 4) + 2) % (ulong)*puVar1) * 2 + 4) = local_72;
      *(short *)(*(long *)(puVar1 + 4) + 2) = *(short *)(*(long *)(puVar1 + 4) + 2) + 1;
      virtio_legacy_notify_queue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
    }
    local_72 = local_72 + 1;
  } while( true );
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len;
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in desciptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
		    buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}